

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserTreeWalker.cpp
# Opt level: O1

void __thiscall
GrcManager::WalkDirectivesTree
          (GrcManager *this,RefAST *ast,int *pnCollisionFix,int *pnAutoKern,
          int *pnCollisionThreshold,int *pnDir)

{
  GrcSymbolTable *this_00;
  pointer pGVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  Symbol this_01;
  uint *puVar6;
  undefined8 uVar7;
  GrcManager *this_02;
  _Alloc_hider _Var8;
  bool fM;
  string staName;
  RefAST astValue;
  RefAST astDirective;
  bool local_329;
  undefined8 *local_328;
  _Alloc_hider local_320;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_310;
  string local_300;
  RefCount<AST> local_2e0;
  RefCount<AST> local_2d8;
  uint *local_2d0;
  RefAST local_2c8;
  RefAST local_2c0;
  RefAST local_2b8;
  RefAST local_2b0;
  RefAST local_2a8;
  RefAST local_2a0;
  RefAST local_298;
  RefAST local_290;
  RefAST local_288;
  RefAST local_280;
  RefAST local_278;
  RefAST local_270;
  uint *local_268;
  uint *local_260;
  string local_258;
  string local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  string local_198;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  uint *local_58;
  string local_50;
  
  local_2d0 = (uint *)pnCollisionFix;
  local_268 = (uint *)pnCollisionThreshold;
  local_260 = (uint *)pnAutoKern;
  local_58 = (uint *)pnDir;
  AST::getFirstChild(ast->ref->ptr);
  if (local_2d8.ref != (Ref *)0x0) {
    do {
      if ((local_2d8.ref)->ptr == (AST *)0x0) break;
      AST::getFirstChild((local_2d8.ref)->ptr);
      AST::getText_abi_cxx11_(&local_300,(AST *)*local_328);
      RefCount<AST>::~RefCount((RefCount<AST> *)&local_328);
      AST::getFirstChild((local_2d8.ref)->ptr);
      AST::getNextSibling((AST *)*local_328);
      RefCount<AST>::~RefCount((RefCount<AST> *)&local_328);
      local_329 = false;
      this_02 = (GrcManager *)(local_2e0.ref)->ptr;
      iVar4 = AST::getType((AST *)this_02);
      if (iVar4 == 0x11) {
        if (local_2e0.ref == (Ref *)0x0) {
          local_270.ref = (Ref *)0x0;
        }
        else {
          (local_2e0.ref)->count = (local_2e0.ref)->count + 1;
          local_270.ref = local_2e0.ref;
        }
        uVar5 = NumericValue(this_02,&local_270,&local_329);
        RefCount<AST>::~RefCount(&local_270);
      }
      else {
        iVar4 = AST::getType((local_2e0.ref)->ptr);
        uVar5 = 0;
        if (iVar4 != 0x51) {
          iVar4 = AST::getType((local_2e0.ref)->ptr);
          uVar5 = 1;
          if (iVar4 != 0x50) {
            local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_78,"Invalid value for directive ","");
            local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_98,local_300._M_dataplus._M_p,
                       local_300._M_dataplus._M_p + local_300._M_string_length);
            local_278 = (RefAST)ast->ref;
            if (local_278.ref == (Ref *)0x0) {
              local_278.ref = (Ref *)0x0;
            }
            else {
              (local_278.ref)->count = (local_278.ref)->count + 1;
            }
            LineAndFile((GrpLineAndFile *)&local_328,this,&local_278);
            GrcErrorList::AddItem
                      (&g_errorList,true,0x4ab,(GdlObject *)0x0,(GrpLineAndFile *)&local_328,
                       &local_78,&local_98,(string *)0x0,(string *)0x0,(string *)0x0,(string *)0x0,
                       (string *)0x0,(string *)0x0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_320._M_p != &local_310) {
              operator_delete(local_320._M_p,local_310._M_allocated_capacity + 1);
            }
            RefCount<AST>::~RefCount(&local_278);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_98._M_dataplus._M_p != &local_98.field_2) {
              operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
            }
            uVar5 = 0xffffffff;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_78._M_dataplus._M_p != &local_78.field_2) {
              operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
            }
          }
        }
      }
      this_00 = this->m_psymtbl;
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b8,local_300._M_dataplus._M_p,
                 local_300._M_dataplus._M_p + local_300._M_string_length);
      this_01 = GrcSymbolTable::FindSymbol(this_00,&local_b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      if ((this_01 == (Symbol)0x0) ||
         (bVar3 = GrcSymbolTableEntry::FitsSymbolType(this_01,ksymtDirective), bVar2 = local_329,
         !bVar3)) {
        local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_d8,"Invalid directive: ","");
        local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_f8,local_300._M_dataplus._M_p,
                   local_300._M_dataplus._M_p + local_300._M_string_length);
        local_280 = (RefAST)ast->ref;
        if (local_280.ref == (Ref *)0x0) {
          local_280.ref = (Ref *)0x0;
        }
        else {
          (local_280.ref)->count = (local_280.ref)->count + 1;
        }
        LineAndFile((GrpLineAndFile *)&local_328,this,&local_280);
        GrcErrorList::AddItem
                  (&g_errorList,true,0x46d,(GdlObject *)0x0,(GrpLineAndFile *)&local_328,&local_d8,
                   &local_f8,(string *)0x0,(string *)0x0,(string *)0x0,(string *)0x0,(string *)0x0,
                   (string *)0x0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_320._M_p != &local_310) {
          operator_delete(local_320._M_p,local_310._M_allocated_capacity + 1);
        }
        RefCount<AST>::~RefCount(&local_280);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
        }
        uVar7 = local_d8.field_2._M_allocated_capacity;
        _Var8._M_p = local_d8._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) goto LAB_001cbde2;
      }
      else {
        if ((local_329 == true) && (this_01->m_expt != kexptMeas)) {
          local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"The ","");
          local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_138,local_300._M_dataplus._M_p,
                     local_300._M_dataplus._M_p + local_300._M_string_length);
          local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_158," directive does not expect a scaled value","");
          local_288 = (RefAST)ast->ref;
          if (local_288.ref == (Ref *)0x0) {
            local_288.ref = (Ref *)0x0;
          }
          else {
            (local_288.ref)->count = (local_288.ref)->count + 1;
          }
          LineAndFile((GrpLineAndFile *)&local_328,this,&local_288);
          GrcErrorList::AddItem
                    (&g_errorList,true,0x46e,(GdlObject *)0x0,(GrpLineAndFile *)&local_328,
                     &local_118,&local_138,&local_158,(string *)0x0,(string *)0x0,(string *)0x0,
                     (string *)0x0,(string *)0x0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_320._M_p != &local_310) {
            operator_delete(local_320._M_p,local_310._M_allocated_capacity + 1);
          }
          RefCount<AST>::~RefCount(&local_288);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_158._M_dataplus._M_p != &local_158.field_2) {
            operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p != &local_138.field_2) {
            operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p != &local_118.field_2) {
            operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
          }
        }
        iVar4 = std::__cxx11::string::compare((char *)&local_300);
        if (iVar4 == 0) {
          (this->m_venv).super__Vector_base<GrcEnv,_std::allocator<GrcEnv>_>._M_impl.
          super__Vector_impl_data._M_finish[-1].m_fAttrOverride = uVar5 != 0;
        }
        else {
          iVar4 = std::__cxx11::string::compare((char *)&local_300);
          if (iVar4 == 0) {
            (this->m_venv).super__Vector_base<GrcEnv,_std::allocator<GrcEnv>_>._M_impl.
            super__Vector_impl_data._M_finish[-1].m_wCodePage = (utf16)uVar5;
          }
          else {
            iVar4 = std::__cxx11::string::compare((char *)&local_300);
            if (iVar4 == 0) {
              (this->m_venv).super__Vector_base<GrcEnv,_std::allocator<GrcEnv>_>._M_impl.
              super__Vector_impl_data._M_finish[-1].m_nMaxRuleLoop = uVar5;
            }
            else {
              iVar4 = std::__cxx11::string::compare((char *)&local_300);
              if (iVar4 == 0) {
                (this->m_venv).super__Vector_base<GrcEnv,_std::allocator<GrcEnv>_>._M_impl.
                super__Vector_impl_data._M_finish[-1].m_nMaxBackup = uVar5;
              }
              else {
                iVar4 = std::__cxx11::string::compare((char *)&local_300);
                if (iVar4 == 0) {
                  (this->m_venv).super__Vector_base<GrcEnv,_std::allocator<GrcEnv>_>._M_impl.
                  super__Vector_impl_data._M_finish[-1].m_mUnits = uVar5;
                }
                else {
                  iVar4 = std::__cxx11::string::compare((char *)&local_300);
                  if (iVar4 == 0) {
                    if (bVar2 == false) {
                      local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_178,
                                 "The PointRadius directive requires a scaled value","");
                      local_290 = (RefAST)ast->ref;
                      if (local_290.ref == (Ref *)0x0) {
                        local_290.ref = (Ref *)0x0;
                      }
                      else {
                        (local_290.ref)->count = (local_290.ref)->count + 1;
                      }
                      LineAndFile((GrpLineAndFile *)&local_328,this,&local_290);
                      GrcErrorList::AddError
                                (&g_errorList,0x46f,(GdlObject *)0x0,&local_178,
                                 (GrpLineAndFile *)&local_328);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_320._M_p != &local_310) {
                        operator_delete(local_320._M_p,local_310._M_allocated_capacity + 1);
                      }
                      RefCount<AST>::~RefCount(&local_290);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_178._M_dataplus._M_p != &local_178.field_2) {
                        operator_delete(local_178._M_dataplus._M_p,
                                        local_178.field_2._M_allocated_capacity + 1);
                      }
                    }
                    pGVar1 = (this->m_venv).super__Vector_base<GrcEnv,_std::allocator<GrcEnv>_>.
                             _M_impl.super__Vector_impl_data._M_finish;
                    pGVar1[-1].m_nPointRadius = uVar5;
                    pGVar1[-1].m_mPrUnits = pGVar1[-1].m_mUnits;
                  }
                  else {
                    iVar4 = std::__cxx11::string::compare((char *)&local_300);
                    if (iVar4 == 0) {
                      if (local_2d0 == (uint *)0x0) {
                        local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)&local_198,
                                   "The CollisionFix directive must be indicated directly on a pass"
                                   ,"");
                        local_298 = (RefAST)ast->ref;
                        if (local_298.ref == (Ref *)0x0) {
                          local_298.ref = (Ref *)0x0;
                        }
                        else {
                          (local_298.ref)->count = (local_298.ref)->count + 1;
                        }
                        LineAndFile((GrpLineAndFile *)&local_328,this,&local_298);
                        GrcErrorList::AddError
                                  (&g_errorList,0x4a1,(GdlObject *)0x0,&local_198,
                                   (GrpLineAndFile *)&local_328);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_320._M_p != &local_310) {
                          operator_delete(local_320._M_p,local_310._M_allocated_capacity + 1);
                        }
                        RefCount<AST>::~RefCount(&local_298);
                        uVar7 = local_198.field_2._M_allocated_capacity;
                        _Var8._M_p = local_198._M_dataplus._M_p;
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_198._M_dataplus._M_p != &local_198.field_2) goto LAB_001cbde2;
                      }
                      else {
                        iVar4 = AST::getType((local_2e0.ref)->ptr);
                        if (iVar4 == 0x50) {
                          *local_2d0 = 3;
                        }
                        else {
                          puVar6 = local_2d0;
                          if (uVar5 < 8) goto LAB_001cc572;
                          local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)&local_1b8,
                                     "The CollisionFix value must be between 0 and ","");
                          std::__cxx11::to_string(&local_50,7);
                          local_2a0 = (RefAST)ast->ref;
                          if (local_2a0.ref == (Ref *)0x0) {
                            local_2a0.ref = (Ref *)0x0;
                          }
                          else {
                            (local_2a0.ref)->count = (local_2a0.ref)->count + 1;
                          }
                          LineAndFile((GrpLineAndFile *)&local_328,this,&local_2a0);
                          GrcErrorList::AddItem
                                    (&g_errorList,true,0x4a2,(GdlObject *)0x0,
                                     (GrpLineAndFile *)&local_328,&local_1b8,&local_50,(string *)0x0
                                     ,(string *)0x0,(string *)0x0,(string *)0x0,(string *)0x0,
                                     (string *)0x0);
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_320._M_p != &local_310) {
                            operator_delete(local_320._M_p,local_310._M_allocated_capacity + 1);
                          }
                          RefCount<AST>::~RefCount(&local_2a0);
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_50._M_dataplus._M_p != &local_50.field_2) {
                            operator_delete(local_50._M_dataplus._M_p,
                                            local_50.field_2._M_allocated_capacity + 1);
                          }
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
                            operator_delete(local_1b8._M_dataplus._M_p,
                                            local_1b8.field_2._M_allocated_capacity + 1);
                          }
                          *local_2d0 = 7;
                        }
                      }
                    }
                    else {
                      iVar4 = std::__cxx11::string::compare((char *)&local_300);
                      if (iVar4 == 0) {
                        if (local_260 == (uint *)0x0) {
                          local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)&local_1d8,
                                     "The AutoKern directive must be indicated directly on a pass",
                                     "");
                          local_2a8 = (RefAST)ast->ref;
                          if (local_2a8.ref == (Ref *)0x0) {
                            local_2a8.ref = (Ref *)0x0;
                          }
                          else {
                            (local_2a8.ref)->count = (local_2a8.ref)->count + 1;
                          }
                          LineAndFile((GrpLineAndFile *)&local_328,this,&local_2a8);
                          GrcErrorList::AddError
                                    (&g_errorList,0x4a5,(GdlObject *)0x0,&local_1d8,
                                     (GrpLineAndFile *)&local_328);
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_320._M_p != &local_310) {
                            operator_delete(local_320._M_p,local_310._M_allocated_capacity + 1);
                          }
                          RefCount<AST>::~RefCount(&local_2a8);
                          uVar7 = local_1d8.field_2._M_allocated_capacity;
                          _Var8._M_p = local_1d8._M_dataplus._M_p;
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
LAB_001cbde2:
                            operator_delete(_Var8._M_p,uVar7 + 1);
                          }
                        }
                        else {
                          puVar6 = local_260;
                          if (uVar5 < 3) goto LAB_001cc572;
                          local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)&local_1f8,
                                     "The AutoKern value should be 0 (NONE), 1 (FULL), or 2 (NOSPACE)"
                                     ,"");
                          local_2b0 = (RefAST)ast->ref;
                          if (local_2b0.ref == (Ref *)0x0) {
                            local_2b0.ref = (Ref *)0x0;
                          }
                          else {
                            (local_2b0.ref)->count = (local_2b0.ref)->count + 1;
                          }
                          LineAndFile((GrpLineAndFile *)&local_328,this,&local_2b0);
                          GrcErrorList::AddWarning
                                    (&g_errorList,0x5ec,(GdlObject *)0x0,&local_1f8,
                                     (GrpLineAndFile *)&local_328);
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_320._M_p != &local_310) {
                            operator_delete(local_320._M_p,local_310._M_allocated_capacity + 1);
                          }
                          RefCount<AST>::~RefCount(&local_2b0);
                          uVar7 = local_1f8.field_2._M_allocated_capacity;
                          _Var8._M_p = local_1f8._M_dataplus._M_p;
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_1f8._M_dataplus._M_p != &local_1f8.field_2)
                          goto LAB_001cbde2;
                        }
                      }
                      else {
                        iVar4 = std::__cxx11::string::compare((char *)&local_300);
                        if (iVar4 == 0) {
                          if (local_268 == (uint *)0x0) {
                            local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
                            std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)&local_218,
                                       "The CollisionThreshold directive must be indicated directly on a pass"
                                       ,"");
                            local_2b8 = (RefAST)ast->ref;
                            if (local_2b8.ref == (Ref *)0x0) {
                              local_2b8.ref = (Ref *)0x0;
                            }
                            else {
                              (local_2b8.ref)->count = (local_2b8.ref)->count + 1;
                            }
                            LineAndFile((GrpLineAndFile *)&local_328,this,&local_2b8);
                            GrcErrorList::AddError
                                      (&g_errorList,0x4a6,(GdlObject *)0x0,&local_218,
                                       (GrpLineAndFile *)&local_328);
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_320._M_p != &local_310) {
                              operator_delete(local_320._M_p,local_310._M_allocated_capacity + 1);
                            }
                            RefCount<AST>::~RefCount(&local_2b8);
                            uVar7 = local_218.field_2._M_allocated_capacity;
                            _Var8._M_p = local_218._M_dataplus._M_p;
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_218._M_dataplus._M_p != &local_218.field_2)
                            goto LAB_001cbde2;
                          }
                          else {
                            puVar6 = local_268;
                            if (0xffffff00 < uVar5 - 0x100) goto LAB_001cc572;
                            local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
                            std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)&local_238,
                                       "The CollisionThreshold value must be between 1 and 255","");
                            local_2c0 = (RefAST)ast->ref;
                            if (local_2c0.ref == (Ref *)0x0) {
                              local_2c0.ref = (Ref *)0x0;
                            }
                            else {
                              (local_2c0.ref)->count = (local_2c0.ref)->count + 1;
                            }
                            LineAndFile((GrpLineAndFile *)&local_328,this,&local_2c0);
                            GrcErrorList::AddError
                                      (&g_errorList,0x4a7,(GdlObject *)0x0,&local_238,
                                       (GrpLineAndFile *)&local_328);
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_320._M_p != &local_310) {
                              operator_delete(local_320._M_p,local_310._M_allocated_capacity + 1);
                            }
                            RefCount<AST>::~RefCount(&local_2c0);
                            uVar7 = local_238.field_2._M_allocated_capacity;
                            _Var8._M_p = local_238._M_dataplus._M_p;
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_238._M_dataplus._M_p != &local_238.field_2)
                            goto LAB_001cbde2;
                          }
                        }
                        else {
                          iVar4 = std::__cxx11::string::compare((char *)&local_300);
                          if (iVar4 == 0) {
                            puVar6 = local_58;
                            if (local_58 == (uint *)0x0) {
                              local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
                              std::__cxx11::string::_M_construct<char_const*>
                                        ((string *)&local_258,
                                         "The Direction directive must be indicated directly on a pass"
                                         ,"");
                              local_2c8 = (RefAST)ast->ref;
                              if (local_2c8.ref == (Ref *)0x0) {
                                local_2c8.ref = (Ref *)0x0;
                              }
                              else {
                                (local_2c8.ref)->count = (local_2c8.ref)->count + 1;
                              }
                              LineAndFile((GrpLineAndFile *)&local_328,this,&local_2c8);
                              GrcErrorList::AddError
                                        (&g_errorList,0x4aa,(GdlObject *)0x0,&local_258,
                                         (GrpLineAndFile *)&local_328);
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_320._M_p != &local_310) {
                                operator_delete(local_320._M_p,local_310._M_allocated_capacity + 1);
                              }
                              RefCount<AST>::~RefCount(&local_2c8);
                              uVar7 = local_258.field_2._M_allocated_capacity;
                              _Var8._M_p = local_258._M_dataplus._M_p;
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_258._M_dataplus._M_p != &local_258.field_2)
                              goto LAB_001cbde2;
                            }
                            else {
LAB_001cc572:
                              *puVar6 = uVar5;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      AST::getNextSibling((local_2d8.ref)->ptr);
      RefCount<AST>::operator=(&local_2d8,(RefCount<AST> *)&local_328);
      RefCount<AST>::~RefCount((RefCount<AST> *)&local_328);
      RefCount<AST>::~RefCount(&local_2e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_300._M_dataplus._M_p != &local_300.field_2) {
        operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
      }
    } while (local_2d8.ref != (Ref *)0x0);
  }
  RefCount<AST>::~RefCount(&local_2d8);
  return;
}

Assistant:

void GrcManager::WalkDirectivesTree(RefAST ast, int * pnCollisionFix, int * pnAutoKern,
	int * pnCollisionThreshold, int * pnDir)
{
	Assert(ast->getType() == Zdirectives);

	RefAST astDirective = ast->getFirstChild();
	while (astDirective)
	{
		std::string staName = astDirective->getFirstChild()->getText();
		//	For now, all directives have numeric or boolean values.
		RefAST astValue = astDirective->getFirstChild()->getNextSibling();
		Assert(astValue);
		int nValue = -1;
		bool fM = false;
		if (astValue->getType() == LIT_INT)
			nValue = NumericValue(astValue, &fM);
		else if (astValue->getType() == LITERAL_false)
			nValue = 0;
		else if (astValue->getType() == LITERAL_true)
			nValue = 1;
		else
		{
			g_errorList.AddError(1195, NULL,
				"Invalid value for directive ", staName,
				LineAndFile(ast));
		}

		Symbol psym = SymbolTable()->FindSymbol(staName);
		if (!psym || !psym->FitsSymbolType(ksymtDirective))
			g_errorList.AddError(1133, NULL,
				"Invalid directive: ",
				staName,
				LineAndFile(ast));
		else
		{
			if (fM && psym->ExpType() != kexptMeas)
				g_errorList.AddError(1134, NULL,
					"The ",
					staName,
					" directive does not expect a scaled value",
					LineAndFile(ast));

			if (staName == "AttributeOverride")
				SetAttrOverride(nValue != 0);
			
			else if (staName == "CodePage")
				SetCodePage(nValue);

			else if (staName == "MaxRuleLoop")
				SetMaxRuleLoop(nValue);

			else if (staName == "MaxBackup")
				SetMaxBackup(nValue);

			else if (staName == "MUnits")
				SetMUnits(nValue);

			else if (staName == "PointRadius")
			{
				Assert(psym->ExpType() == kexptMeas);
				if (!fM)
					g_errorList.AddError(1135, NULL,
						"The PointRadius directive requires a scaled value",
						LineAndFile(ast));
				SetPointRadius(nValue, MUnits());
			}
			else if (staName == "CollisionFix")
			{
				if (pnCollisionFix == NULL)
					g_errorList.AddError(1185, NULL,
						"The CollisionFix directive must be indicated directly on a pass",
						LineAndFile(ast));
				else
				{
					if (astValue->getType() == LITERAL_true)
						*pnCollisionFix = 3;	// default; should this be 1??
					else if (nValue > kMaxColIterations || nValue < 0)
					{
						g_errorList.AddError(1186, NULL,
							"The CollisionFix value must be between 0 and ",
							std::to_string(kMaxColIterations),
							LineAndFile(ast));
						*pnCollisionFix = kMaxColIterations;
					}
					else
						*pnCollisionFix = nValue;
				}
			}
			else if (staName == "AutoKern")
			{
				if (pnAutoKern == NULL)
					g_errorList.AddError(1189, NULL,
						"The AutoKern directive must be indicated directly on a pass",
						LineAndFile(ast));
				else if (nValue != kakNone && nValue != kakFull && nValue != kakNoSpace)
					g_errorList.AddWarning(1516, NULL,
						"The AutoKern value should be 0 (NONE), 1 (FULL), or 2 (NOSPACE)",
						LineAndFile(ast));
				else
					*pnAutoKern = nValue;
			}
			else if (staName == "CollisionThreshold")
			{
				if (pnCollisionThreshold == NULL)
					g_errorList.AddError(1190, NULL,
						"The CollisionThreshold directive must be indicated directly on a pass",
						LineAndFile(ast));
				else if (nValue < 1 || nValue > 255)
					g_errorList.AddError(1191, NULL,
						"The CollisionThreshold value must be between 1 and 255",
						LineAndFile(ast));
				else
					*pnCollisionThreshold = nValue;
			}
			else if (staName == "Direction")
			{
				if (pnDir == NULL)
					g_errorList.AddError(1194, NULL,
						"The Direction directive must be indicated directly on a pass",
						LineAndFile(ast));
				else
					*pnDir = nValue;
			}
			else
			{
				Assert(false);
			}
		}

		astDirective = astDirective->getNextSibling();
	}
}